

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_floating<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  element_type *peVar3;
  long lVar4;
  undefined1 *__dest;
  int iVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  error_info *v;
  basic_value<toml::type_config> *v_00;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *prVar8;
  scanner_storage *other;
  success_type sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  basic_value<toml::type_config> *ctx_00;
  _Alloc_hider _Var11;
  bool bVar12;
  uint uVar13;
  string str;
  result<double,_toml::error_info> res;
  source_location src;
  region reg;
  location first;
  success_type local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *local_7e8;
  undefined1 local_7e0 [8];
  char *pcStack_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  long local_7b0;
  undefined1 local_7a8 [8];
  undefined1 local_7a0 [96];
  undefined1 local_740 [8];
  undefined1 auStack_738 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720 [2];
  undefined8 local_700;
  undefined1 local_6f8 [24];
  pointer local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_6d8 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_690;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  _func_int **local_598;
  char *pcStack_590;
  _Alloc_hider local_588;
  size_type local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  region local_568;
  location local_4f8;
  undefined1 local_4b0 [32];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_490;
  _Alloc_hider local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468 [2];
  source_location local_448;
  region_type local_3c8;
  location local_360;
  location local_318;
  failure<toml::error_info> local_2d0;
  source_location local_278;
  basic_value<toml::type_config> local_200;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  location::location(&local_4f8,loc);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  local_808._M_string_length = 0;
  local_808.field_2._M_local_buf[0] = '\0';
  region::region(&local_568);
  local_7e8 = __return_storage_ptr__;
  if ((ctx->toml_spec_).ext_hex_float == true) {
    local_4b0._0_8_ = &PTR__scanner_base_00555890;
    local_4b0[8] = '0';
    local_7e0 = (undefined1  [8])&PTR__scanner_base_00555890;
    pcStack_7d8 = (char *)CONCAT71(pcStack_7d8._1_7_,0x78);
    sequence::sequence<toml::detail::character,toml::detail::character>
              ((sequence *)local_7a8,(character *)local_4b0,(character *)local_7e0);
    sequence::scan((region *)local_740,(sequence *)local_7a8,loc);
    lVar4 = CONCAT71(local_740._1_7_,local_740[0]);
    region::~region((region *)local_740);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )local_7a0);
    prVar8 = local_7e8;
    if (lVar4 == 0) goto LAB_003cda0f;
    (loc->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_4f8.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(loc->source_).
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &local_4f8.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&loc->source_name_,&local_4f8.source_name_);
    loc->column_number_ = local_4f8.column_number_;
    loc->location_ = CONCAT44(local_4f8.location_._4_4_,(undefined4)local_4f8.location_);
    loc->line_number_ = CONCAT44(local_4f8.line_number_._4_4_,(undefined4)local_4f8.line_number_);
    syntax::hex_floating((sequence *)local_7a8,&ctx->toml_spec_);
    sequence::scan((region *)local_740,(sequence *)local_7a8,loc);
    region::operator=(&local_568,(region *)local_740);
    region::~region((region *)local_740);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )local_7a0);
    if (local_568.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_5d8,
                 "toml::parse_floating: invalid hex floating: float must be like: 0xABCp-3f","");
      syntax::floating((either *)local_7a8,&ctx->toml_spec_);
      location::location(&local_318,loc);
      local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"");
      make_syntax_error<toml::detail::either>
                ((error_info *)local_740,&local_5d8,(either *)local_7a8,&local_318,&local_5f8);
      err<toml::error_info>(&local_88,(error_info *)local_740);
      prVar8->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(prVar8->field_1).succ_,&local_88);
      failure<toml::error_info>::~failure(&local_88);
      if ((undefined1 *)CONCAT44(local_720[1]._12_4_,local_720[1]._8_4_) != local_6f8) {
        operator_delete((undefined1 *)CONCAT44(local_720[1]._12_4_,local_720[1]._8_4_),
                        local_6f8._0_8_ + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_720);
      if ((undefined1 *)CONCAT71(local_740._1_7_,local_740[0]) != auStack_738 + 8) {
        operator_delete((undefined1 *)CONCAT71(local_740._1_7_,local_740[0]),
                        CONCAT44(auStack_738._12_4_,auStack_738._8_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
      }
      location::~location(&local_318);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)local_7a0);
      _Var11._M_p = local_5d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p == &local_5d8.field_2) goto LAB_003cde1f;
      goto LAB_003cde17;
    }
    puVar2 = ((local_568.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)local_740,(detail *)(puVar2 + local_568.first_),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar2 + local_568.last_),in_RCX);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_808,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740);
    if ((undefined1 *)CONCAT71(local_740._1_7_,local_740[0]) != auStack_738 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_740._1_7_,local_740[0]),
                      CONCAT44(auStack_738._12_4_,auStack_738._8_4_) + 1);
    }
    pcStack_7d8 = (char *)0x0;
    local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
    local_7d0._M_string_length = 0;
    local_7d0.field_2._M_local_buf[0] = '\0';
    local_7e0[0] = 3;
    bVar12 = true;
  }
  else {
LAB_003cda0f:
    syntax::floating((either *)local_7a8,&ctx->toml_spec_);
    if (local_7a0._0_8_ != local_7a0._8_8_) {
      sVar9.value = (value_type_conflict3)local_7a0._0_8_;
      do {
        (**(code **)(*(long *)*(unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                *)sVar9.value + 0x10))
                  ((region *)local_740,
                   (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
                    )*(unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                       *)sVar9.value,loc);
        if (CONCAT71(local_740._1_7_,local_740[0]) != 0) goto LAB_003cda70;
        region::~region((region *)local_740);
        sVar9.value = sVar9.value + 8;
      } while (sVar9.value != (value_type_conflict3)local_7a0._8_8_);
    }
    region::region((region *)local_740);
LAB_003cda70:
    region::operator=(&local_568,(region *)local_740);
    region::~region((region *)local_740);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )local_7a0);
    if (local_568.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_618,
                 "toml::parse_floating: invalid floating: float must be like: -3.14159_26535, 6.022e+23, inf, or nan (lowercase)."
                 ,"");
      prVar8 = local_7e8;
      syntax::floating((either *)local_7a8,&ctx->toml_spec_);
      location::location(&local_360,loc);
      local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"");
      make_syntax_error<toml::detail::either>
                ((error_info *)local_740,&local_618,(either *)local_7a8,&local_360,&local_638);
      err<toml::error_info>(&local_e0,(error_info *)local_740);
      prVar8->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(prVar8->field_1).succ_,&local_e0);
      failure<toml::error_info>::~failure(&local_e0);
      if ((undefined1 *)CONCAT44(local_720[1]._12_4_,local_720[1]._8_4_) != local_6f8) {
        operator_delete((undefined1 *)CONCAT44(local_720[1]._12_4_,local_720[1]._8_4_),
                        local_6f8._0_8_ + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_720);
      if ((undefined1 *)CONCAT71(local_740._1_7_,local_740[0]) != auStack_738 + 8) {
        operator_delete((undefined1 *)CONCAT71(local_740._1_7_,local_740[0]),
                        CONCAT44(auStack_738._12_4_,auStack_738._8_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._M_dataplus._M_p != &local_638.field_2) {
        operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
      }
      location::~location(&local_360);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)local_7a0);
      local_5d8.field_2._M_allocated_capacity = local_618.field_2._M_allocated_capacity;
      _Var11._M_p = local_618._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_dataplus._M_p == &local_618.field_2) goto LAB_003cde1f;
LAB_003cde17:
      operator_delete(_Var11._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      goto LAB_003cde1f;
    }
    puVar2 = ((local_568.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)local_740,(detail *)(puVar2 + local_568.first_),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar2 + local_568.last_),in_RCX);
    prVar8 = local_7e8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_808,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740);
    if ((undefined1 *)CONCAT71(local_740._1_7_,local_740[0]) != auStack_738 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_740._1_7_,local_740[0]),
                      CONCAT44(auStack_738._12_4_,auStack_738._8_4_) + 1);
    }
    local_7e0 = (undefined1  [8])((ulong)local_7e0 & 0xffffffffffffff00);
    pcStack_7d8 = (char *)0x0;
    local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
    local_7d0._M_string_length = 0;
    local_7d0.field_2._M_local_buf[0] = '\0';
    local_740[0] = true;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_808._M_dataplus._M_p,
                       local_808._M_dataplus._M_p + local_808._M_string_length);
    if (_Var6._M_current == local_808._M_dataplus._M_p + local_808._M_string_length) {
      local_7a8[0] = true;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_808._M_dataplus._M_p,
                         local_808._M_dataplus._M_p + local_808._M_string_length);
      if (_Var6._M_current != local_808._M_dataplus._M_p + local_808._M_string_length)
      goto LAB_003cdf3b;
      local_7e0[0] = 1;
    }
    else {
LAB_003cdf3b:
      local_7e0[0] = 2;
    }
    bVar12 = false;
  }
  paVar10 = &local_7d0.field_2;
  local_740[0] = true;
  _Var6 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_808._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_808._M_dataplus._M_p + local_808._M_string_length),
                     (_Iter_equals_val<const_char>)local_740);
  local_808._M_string_length = (long)_Var6._M_current - (long)local_808._M_dataplus._M_p;
  *_Var6._M_current = '\0';
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_808,"inf");
  local_810.value = INFINITY;
  if ((iVar5 == 0) ||
     (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_808,"+inf"), iVar5 == 0)) {
LAB_003ce0cd:
    if ((ctx->toml_spec_).ext_num_suffix == true) {
      peVar3 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      last._M_current =
           (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
      if ((loc->location_ <
           (ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_finish - (long)last._M_current)) &&
         (last._M_current[loc->location_] == '_')) {
        syntax::num_suffix((sequence *)local_740,&ctx->toml_spec_);
        sequence::scan((region *)local_7a8,(sequence *)local_740,loc);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 *)auStack_738);
        if ((long *)CONCAT71(local_7a8._1_7_,local_7a8[0]) == (long *)0x0) {
          region::region((region *)local_4b0,loc);
          source_location::source_location((source_location *)local_740,(region *)local_4b0);
          region::~region((region *)local_4b0);
          (loc->source_).
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_4f8.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(loc->source_).
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     &local_4f8.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&loc->source_name_,&local_4f8.source_name_);
          loc->column_number_ = local_4f8.column_number_;
          *(undefined4 *)&loc->location_ = (undefined4)local_4f8.location_;
          *(undefined4 *)((long)&loc->location_ + 4) = local_4f8.location_._4_4_;
          *(undefined4 *)&loc->line_number_ = (undefined4)local_4f8.line_number_;
          *(undefined4 *)((long)&loc->line_number_ + 4) = local_4f8.line_number_._4_4_;
          local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_658,
                     "toml::parse_floating: invalid suffix: should be `_ non-digit-graph (graph | _graph)`"
                     ,"");
          local_448._1_7_ = local_740._1_7_;
          local_448.is_ok_ = local_740[0];
          local_448.file_name_._M_dataplus._M_p = (pointer)&local_448.file_name_.field_2;
          local_448.last_offset_._0_4_ = local_720[1]._0_4_;
          local_448.last_offset_._4_4_ = local_720[1]._4_4_;
          local_448.length_._0_4_ = local_720[1]._8_4_;
          local_448.length_._4_4_ = local_720[1]._12_4_;
          local_448.last_line_._0_4_ = (undefined4)local_720[0]._M_allocated_capacity;
          local_448.last_line_._4_4_ = local_720[0]._M_allocated_capacity._4_4_;
          local_448.last_column_._0_4_ = local_720[0]._8_4_;
          local_448.last_column_._4_4_ = local_720[0]._12_4_;
          local_448.first_column_._0_4_ = auStack_738._8_4_;
          local_448.first_column_._4_4_ = auStack_738._12_4_;
          local_448.first_offset_._0_4_ = auStack_738._16_4_;
          local_448.first_offset_._4_4_ = auStack_738._20_4_;
          local_448.first_line_ = auStack_738._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_6f8 + 8)) {
            local_448.file_name_.field_2._8_8_ = local_6f8._16_8_;
          }
          else {
            local_448.file_name_._M_dataplus._M_p = (pointer)local_700;
          }
          local_448.file_name_._M_string_length = local_6f8._0_8_;
          local_6f8._0_8_ = 0;
          local_6f8[8] = '\0';
          local_448.line_str_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_6e0;
          local_448.line_str_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)aaStack_6d8[0]._0_8_;
          local_448.line_str_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aaStack_6d8[0]._8_8_;
          local_6e0 = (pointer)0x0;
          aaStack_6d8[0]._M_allocated_capacity = (pointer)0x0;
          aaStack_6d8[0]._8_8_ = (pointer)0x0;
          local_700 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_6f8 + 8);
          local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"here","");
          make_error_info<>((error_info *)local_4b0,&local_658,&local_448,&local_678);
          err<toml::error_info>(&local_138,(error_info *)local_4b0);
          prVar8->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(prVar8->field_1).succ_,&local_138);
          failure<toml::error_info>::~failure(&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_p != local_468) {
            operator_delete(local_478._M_p,local_468[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_490);
          if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
            operator_delete((void *)local_4b0._0_8_,(ulong)(local_4b0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678._M_dataplus._M_p != &local_678.field_2) {
            operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location(&local_448);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)local_740);
          region::~region((region *)local_7a8);
          goto LAB_003ce652;
        }
        lVar4 = *(long *)CONCAT71(local_7a8._1_7_,local_7a8[0]);
        make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((string *)local_740,
                   (detail *)(&((source_location *)local_7a0._48_8_)->is_ok_ + lVar4),
                   (uchar *)(lVar4 + local_7a0._72_8_),last);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_738._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
          __dest = (undefined1 *)CONCAT71(local_740._1_7_,local_740[0]);
          if ((undefined1 *)(auStack_738._0_8_ - 1) == (undefined1 *)0x1) {
            *__dest = __dest[1];
          }
          else {
            memmove(__dest,__dest + 1,auStack_738._0_8_ - 1);
          }
        }
        *(undefined1 *)(CONCAT71(local_740._1_7_,local_740[0]) + -1 + auStack_738._0_8_) = 0;
        auStack_738._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(auStack_738._0_8_ + -1)
        ;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_7d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740);
        if ((undefined1 *)CONCAT71(local_740._1_7_,local_740[0]) != auStack_738 + 8) {
          operator_delete((undefined1 *)CONCAT71(local_740._1_7_,local_740[0]),
                          CONCAT44(auStack_738._12_4_,auStack_738._8_4_) + 1);
        }
        region::~region((region *)local_7a8);
      }
    }
    local_598 = (_func_int **)local_7e0;
    pcStack_590 = pcStack_7d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d0._M_dataplus._M_p == paVar10) {
      local_578._8_8_ = local_7d0.field_2._8_8_;
      local_588._M_p = (pointer)&local_578;
    }
    else {
      local_588._M_p = local_7d0._M_dataplus._M_p;
    }
    local_578._M_allocated_capacity._1_7_ = local_7d0.field_2._M_allocated_capacity._1_7_;
    local_578._M_local_buf[0] = local_7d0.field_2._M_local_buf[0];
    local_580 = local_7d0._M_string_length;
    local_7d0._M_string_length = 0;
    local_7d0.field_2._M_local_buf[0] = '\0';
    local_5b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_568.source_name_.field_2;
    local_3c8.source_name_._M_dataplus._M_p = (pointer)&local_3c8.source_name_.field_2;
    local_3c8.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_568.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_3c8.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_568.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_568.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_568.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568.source_name_._M_dataplus._M_p == paVar1) {
      local_3c8.source_name_.field_2._8_8_ = local_568.source_name_.field_2._8_8_;
    }
    else {
      local_3c8.source_name_._M_dataplus._M_p = local_568.source_name_._M_dataplus._M_p;
    }
    local_3c8.source_name_._M_string_length = local_568.source_name_._M_string_length;
    local_568.source_name_._M_string_length = 0;
    local_568.source_name_.field_2._M_local_buf[0] = '\0';
    local_3c8.length_ = local_568.length_;
    local_3c8.first_ = local_568.first_;
    local_3c8.first_line_ = local_568.first_line_;
    local_3c8.first_column_ = local_568.first_column_;
    local_3c8.last_ = local_568.last_;
    local_3c8.last_line_ = local_568.last_line_;
    local_3c8.last_column_ = local_568.last_column_;
    local_7d0._M_dataplus._M_p = (pointer)paVar10;
    local_568.source_name_._M_dataplus._M_p = (pointer)paVar1;
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)local_740,local_810.value,
               (floating_format_info *)&local_598,&local_5b8,&local_3c8);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_200,(toml *)local_740,v_00);
    prVar8->is_ok_ = true;
    ctx_00 = &local_200;
    basic_value<toml::type_config>::basic_value(&(prVar8->field_1).succ_.value,&local_200);
    basic_value<toml::type_config>::cleanup(&local_200,(EVP_PKEY_CTX *)ctx_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_200.comments_.comments);
    region::~region(&local_200.region_);
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_740,(EVP_PKEY_CTX *)ctx_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_690);
    region::~region((region *)local_6f8);
    region::~region(&local_3c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5b8);
    prVar8 = local_7e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_p != &local_578) {
      operator_delete(local_588._M_p,local_578._M_allocated_capacity + 1);
      prVar8 = local_7e8;
    }
  }
  else {
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_808,"-inf");
    if (iVar5 == 0) {
      uVar13 = 0xfff00000;
LAB_003ce0c7:
      local_810.value = (value_type_conflict3)((ulong)uVar13 << 0x20);
      goto LAB_003ce0cd;
    }
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_808,"nan");
    local_810.value = NAN;
    if ((iVar5 == 0) ||
       (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_808,"+nan"), iVar5 == 0)) goto LAB_003ce0cd;
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_808,"-nan");
    if (iVar5 == 0) {
      uVar13 = 0xfff80000;
      goto LAB_003ce0c7;
    }
    if (local_808._M_string_length == 0) {
      local_7b0 = 0;
    }
    else {
      local_7b0 = -(ulong)((*local_808._M_dataplus._M_p - 0x2bU & 0xfd) == 0);
    }
    local_740[0] = true;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_808._M_dataplus._M_p,
                       local_808._M_dataplus._M_p + local_808._M_string_length);
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<toml::detail::parse_floating<toml::type_config>(toml::detail::location&,toml::detail::context<toml::type_config>const&)::_lambda(char)_1_>>
                      (local_808._M_dataplus._M_p,
                       local_808._M_dataplus._M_p + local_808._M_string_length);
    if (local_7e0[0] == '\x02') {
      pcStack_7d8 = _Var7._M_current + (local_7b0 - (long)local_808._M_dataplus._M_p);
      if (_Var6._M_current != local_808._M_dataplus._M_p + local_808._M_string_length) {
        pcStack_7d8 = pcStack_7d8 + -1;
      }
    }
    else {
      pcStack_7d8 = (char *)0x11;
      if (local_7e0[0] != '\x03') {
        pcStack_7d8 = _Var7._M_current + ~(ulong)_Var6._M_current;
      }
    }
    region::region((region *)local_7a8,loc);
    source_location::source_location((source_location *)local_740,(region *)local_7a8);
    region::~region((region *)local_7a8);
    source_location::source_location(&local_278,(source_location *)local_740);
    type_config::parse_float
              ((result<double,_toml::error_info> *)local_7a8,&local_808,&local_278,bVar12);
    source_location::~source_location(&local_278);
    bVar12 = local_7a8[0];
    if (local_7a8[0] == true) {
      local_810.value = (value_type_conflict3)local_7a0._0_8_;
    }
    else {
      err<toml::error_info_const&>(&local_2d0,(toml *)local_7a0,v);
      prVar8->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(prVar8->field_1).succ_,&local_2d0);
      failure<toml::error_info>::~failure(&local_2d0);
      local_810.value = 0.0;
    }
    if ((local_7a8[0] & 1U) == 0) {
      failure<toml::error_info>::~failure((failure<toml::error_info> *)local_7a0);
    }
    source_location::~source_location((source_location *)local_740);
    if (bVar12 != false) goto LAB_003ce0cd;
  }
LAB_003ce652:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != paVar10) {
    operator_delete(local_7d0._M_dataplus._M_p,
                    CONCAT71(local_7d0.field_2._M_allocated_capacity._1_7_,
                             local_7d0.field_2._M_local_buf[0]) + 1);
  }
LAB_003cde1f:
  region::~region(&local_568);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,
                    CONCAT71(local_808.field_2._M_allocated_capacity._1_7_,
                             local_808.field_2._M_local_buf[0]) + 1);
  }
  location::~location(&local_4f8);
  return prVar8;
}

Assistant:

result<basic_value<TC>, error_info>
parse_floating(location& loc, const context<TC>& ctx)
{
    using floating_type = typename basic_value<TC>::floating_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    // ----------------------------------------------------------------------
    // check syntax
    bool is_hex = false;
    std::string str;
    region reg;
    if(spec.ext_hex_float && sequence(character('0'), character('x')).scan(loc).is_ok())
    {
        loc = first;
        is_hex = true;

        reg = syntax::hex_floating(spec).scan(loc);
        if( ! reg.is_ok())
        {
            return err(make_syntax_error("toml::parse_floating: "
                "invalid hex floating: float must be like: 0xABCp-3f",
                syntax::floating(spec), loc));
        }
        str = reg.as_string();
    }
    else
    {
        reg = syntax::floating(spec).scan(loc);
        if( ! reg.is_ok())
        {
            return err(make_syntax_error("toml::parse_floating: "
                "invalid floating: float must be like: -3.14159_26535, 6.022e+23, "
                "inf, or nan (lowercase).", syntax::floating(spec), loc));
        }
        str = reg.as_string();
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    floating_format_info fmt;

    if(is_hex)
    {
        fmt.fmt = floating_format::hex;
    }
    else
    {
        // since we already checked that the string conforms the TOML standard.
        if(std::find(str.begin(), str.end(), 'e') != str.end() ||
           std::find(str.begin(), str.end(), 'E') != str.end())
        {
            fmt.fmt = floating_format::scientific; // use exponent part
        }
        else
        {
            fmt.fmt = floating_format::fixed; // do not use exponent part
        }
    }

    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    floating_type val{0};

    if(str == "inf" || str == "+inf")
    {
        TOML11_CONSTEXPR_IF(std::numeric_limits<floating_type>::has_infinity)
        {
            val = std::numeric_limits<floating_type>::infinity();
        }
        else
        {
            return err(make_error_info("toml::parse_floating: inf value found"
                " but the current environment does not support inf. Please"
                " make sure that the floating-point implementation conforms"
                " IEEE 754/ISO 60559 international standard.",
                source_location(region(loc)),
                "floating_type: inf is not supported"));
        }
    }